

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PredefinedIntegerType *type,string_view param_3)

{
  string_view str;
  string_view str_00;
  bool bVar1;
  uint uVar2;
  long in_RSI;
  undefined4 in_stack_ffffffffffffffb8;
  FormatBuffer *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *pcVar3;
  
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0xc09c6b)
  ;
  pcVar3 = *(char **)(in_RSI + 8);
  str._M_str = pcVar3;
  str._M_len = in_stack_ffffffffffffffc8;
  FormatBuffer::append(in_stack_ffffffffffffffc0,str);
  uVar2 = (uint)(*(byte *)(in_RSI + 0x4c) & 1);
  bVar1 = PredefinedIntegerType::isDefaultSigned(ShortInt);
  if (uVar2 != bVar1) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xc09cd0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
    str_00._M_str = pcVar3;
    str_00._M_len = in_stack_ffffffffffffffc8;
    FormatBuffer::append(in_stack_ffffffffffffffc0,str_00);
  }
  return;
}

Assistant:

void TypePrinter::visit(const PredefinedIntegerType& type, std::string_view) {
    buffer->append(type.name);
    if (type.isSigned != PredefinedIntegerType::isDefaultSigned(type.integerKind))
        buffer->append(type.isSigned ? " signed" : " unsigned");
}